

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void initialize_imputer<InputData<double,unsigned_long>,long_double>
               (Imputer *imputer,InputData<double,_unsigned_long> *input_data,size_t ntrees,
               int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  double dVar1;
  size_t sVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  pointer piVar8;
  pointer __s;
  pointer pvVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  ulong uVar11;
  pointer *ppIVar12;
  long lVar13;
  pointer *ppIVar14;
  size_t sVar15;
  pointer pvVar16;
  ulong uVar17;
  double dVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_98;
  pointer *local_80;
  int *local_78;
  int *local_70;
  double local_68;
  size_t local_60;
  double local_58;
  size_t local_50;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_48;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar2 = input_data->ncols_categ;
  imputer->ncols_categ = sVar2;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar2,CONCAT44(in_register_0000000c,nthreads));
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_98.
    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_98);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar3 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  local_a0 = &imputer->col_modes;
  std::vector<int,_std::allocator<int>_>::resize(local_a0,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector(&local_48,ntrees,&local_a1);
  local_98.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_48);
  pdVar5 = input_data->numeric_data;
  if (pdVar5 == (double *)0x0) {
    puVar6 = input_data->Xc_indptr;
    if ((puVar6 != (unsigned_long *)0x0) && (input_data->ncols_numeric != 0)) {
      uVar17 = 0;
      do {
        local_60 = input_data->nrows;
        uVar11 = puVar6[uVar17];
        uVar7 = puVar6[uVar17 + 1];
        if (uVar11 < uVar7) {
          pdVar5 = input_data->Xc;
          pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pdVar3[uVar17];
          do {
            dVar18 = pdVar5[uVar11];
            if (0x7fefffffffffffff < (ulong)ABS(dVar18)) {
              dVar18 = 0.0;
            }
            dVar1 = dVar1 + dVar18;
            pdVar3[uVar17] = dVar1;
            local_60 = local_60 - (0x7fefffffffffffff < (ulong)ABS(pdVar5[uVar11]));
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
        pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_68 = (double)((float)pdVar3[uVar17] /
                           ((float)(long)local_60 + (float)(&DAT_0036b0d8)[(long)local_60 < 0]));
        dVar1 = NAN;
        if (local_60 != 0) {
          dVar1 = local_68;
        }
        pdVar3[uVar17] = dVar1;
        uVar17 = uVar17 + 1;
      } while (uVar17 < input_data->ncols_numeric);
    }
  }
  else if (input_data->ncols_numeric != 0) {
    lVar10 = 0;
    uVar17 = 0;
    do {
      sVar2 = input_data->nrows;
      if (sVar2 == 0) {
        local_50 = 0;
      }
      else {
        pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar1 = pdVar3[uVar17];
        sVar15 = 0;
        local_50 = sVar2;
        do {
          dVar18 = *(double *)((long)pdVar5 + sVar15 * 8 + sVar2 * lVar10);
          if (0x7fefffffffffffff < (ulong)ABS(dVar18)) {
            dVar18 = 0.0;
          }
          dVar1 = dVar1 + dVar18;
          pdVar3[uVar17] = dVar1;
          local_50 = local_50 -
                     (0x7fefffffffffffff <
                     (*(ulong *)((long)pdVar5 + sVar15 * 8 + sVar2 * lVar10) & 0x7fffffffffffffff));
          sVar15 = sVar15 + 1;
        } while (sVar2 != sVar15);
      }
      pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_58 = (double)((float)pdVar3[uVar17] /
                         ((float)(long)local_50 + (float)(&DAT_0036b0d8)[(long)local_50 < 0]));
      dVar1 = NAN;
      if (local_50 != 0) {
        dVar1 = local_58;
      }
      pdVar3[uVar17] = dVar1;
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar17 < input_data->ncols_numeric);
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (long)input_data->max_categ,(allocator_type *)&local_48);
    pvVar9 = local_98.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __s = local_98.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (input_data->ncols_categ != 0) {
      local_78 = input_data->categ_data;
      local_70 = input_data->ncat;
      local_80 = &((local_98.
                    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      piVar8 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_a0 = (vector<int,_std::allocator<int>_> *)
                 (((long)local_98.
                         super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish +
                   (-8 - (long)local_98.
                               super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8
                 );
      lVar10 = 0;
      uVar17 = 0;
      do {
        if (__s != pvVar9) {
          memset(__s,0,(size_t)local_a0);
        }
        if (input_data->nrows != 0) {
          sVar2 = input_data->nrows;
          uVar11 = 0;
          do {
            lVar13 = (long)*(int *)((long)local_78 + uVar11 * 4 + sVar2 * lVar10);
            if (-1 < lVar13) {
              ppIVar12 = &(__s->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar13;
              *ppIVar12 = (pointer)((long)&((*ppIVar12)->num_sum).
                                           super__Vector_base<double,_std::allocator<double>_> + 1);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < input_data->nrows);
        }
        ppIVar12 = (pointer *)__s;
        if (1 < (ulong)(long)local_70[uVar17]) {
          lVar13 = (long)local_70[uVar17] * 8 + -8;
          ppIVar14 = local_80;
          pvVar16 = __s;
          do {
            ppIVar12 = ppIVar14;
            if (*ppIVar14 <=
                (pvVar16->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              ppIVar12 = (pointer *)pvVar16;
            }
            ppIVar14 = ppIVar14 + 1;
            lVar13 = lVar13 + -8;
            pvVar16 = (pointer)ppIVar12;
          } while (lVar13 != 0);
        }
        piVar8[uVar17] = (int)((ulong)((long)ppIVar12 - (long)__s) >> 3);
        uVar17 = uVar17 + 1;
        lVar10 = lVar10 + 4;
      } while (uVar17 < input_data->ncols_categ);
    }
    if (local_98.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}